

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetTrimIsoFlags(ON_Brep *this,ON_BrepFace *face)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (face->m_li).m_count;
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  bVar3 = true;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    bVar2 = SetTrimIsoFlags(this,(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                 super_ON_ClassArray<ON_BrepLoop>.m_a + (face->m_li).m_a[uVar4]);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool
ON_Brep::SetTrimIsoFlags( ON_BrepFace& face )
{
  bool rc = true;
  int fli;
  const int face_loop_count = face.m_li.Count();
  for ( fli = 0; fli < face_loop_count; fli++ ) {
    if ( !SetTrimIsoFlags( m_L[face.m_li[fli]] ) )
      rc = false;
  }
  return rc;
}